

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O0

void __thiscall OpenMD::Rattle::constraintB(Rattle *this)

{
  SimInfo *this_00;
  ConstraintPair *this_01;
  SimInfo *pSVar1;
  long in_RDI;
  RealType RVar2;
  list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> constraints;
  ConstraintPairIterator cpi;
  ConstraintPair *consPair;
  MoleculeIterator mi;
  Molecule *mol;
  ConstraintPair *in_stack_ffffffffffffff78;
  iterator *i;
  SimInfo *in_stack_ffffffffffffff90;
  list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
  *in_stack_ffffffffffffffa8;
  ConstraintWriter *in_stack_ffffffffffffffb0;
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  local_38;
  ConstraintPair *local_30;
  iterator local_28;
  ConstraintPairFuncPtr in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    doConstraint((Rattle *)0x0,in_stack_ffffffffffffffe0);
    RVar2 = Snapshot::getTime(*(Snapshot **)(in_RDI + 0x20));
    if (*(double *)(in_RDI + 0x60) <= RVar2) {
      i = &local_28;
      std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
                ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)i);
      __gnu_cxx::
      __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
      ::__normal_iterator(&local_38);
      std::__cxx11::list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::list
                ((list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                 0x32368d);
      this_00 = (SimInfo *)SimInfo::beginMolecule(in_stack_ffffffffffffff90,(MoleculeIterator *)i);
      pSVar1 = this_00;
      while (pSVar1 != (SimInfo *)0x0) {
        this_01 = Molecule::beginConstraintPair((Molecule *)this_00,i);
        local_30 = this_01;
        while (local_30 != (ConstraintPair *)0x0) {
          std::__cxx11::list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::
          push_back((list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                    this_01,(value_type *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff78 = Molecule::nextConstraintPair((Molecule *)this_00,i);
          local_30 = in_stack_ffffffffffffff78;
        }
        pSVar1 = (SimInfo *)SimInfo::nextMolecule(this_00,(MoleculeIterator *)i);
      }
      ConstraintWriter::writeConstraintForces(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(double *)(in_RDI + 0x60) = *(double *)(in_RDI + 0x58) + *(double *)(in_RDI + 0x60);
      std::__cxx11::list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::~list
                ((list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                 0x323790);
    }
  }
  return;
}

Assistant:

void Rattle::constraintB() {
    if (!doRattle_) return;
    doConstraint(&Rattle::constraintPairB);

    if (currentSnapshot_->getTime() >= currConstraintTime_) {
      Molecule* mol;
      SimInfo::MoleculeIterator mi;
      ConstraintPair* consPair;
      Molecule::ConstraintPairIterator cpi;
      std::list<ConstraintPair*> constraints;
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          constraints.push_back(consPair);
        }
      }
      constraintWriter_->writeConstraintForces(constraints);
      currConstraintTime_ += constraintTime_;
    }
  }